

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<2,151>::ResonanceRange::
print<std::back_insert_iterator<std::__cxx11::string>>
          (ResonanceRange *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF,int MT)

{
  ResonanceRange *__variants;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_151_ResonanceRange_hpp:74:40),_const_std::variant<njoy::ENDFtk::section::Type<2,_151>::SpecialCase,_njoy::ENDFtk::section::Type<2,_151>::SingleLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::MultiLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::ReichMoore,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyIndependent,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependentFissionWidths,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependent>_&>
  _Var1;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_151_ResonanceRange_hpp:86:40),_const_std::variant<njoy::ENDFtk::section::Type<2,_151>::SpecialCase,_njoy::ENDFtk::section::Type<2,_151>::SingleLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::MultiLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::ReichMoore,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyIndependent,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependentFissionWidths,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependent>_&>
  _Var2;
  int local_74;
  int local_70;
  int local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [48];
  
  __variants = this + 0x18;
  local_68 = *(undefined8 *)this;
  uStack_60 = *(undefined8 *)(this + 8);
  local_74 = MT;
  local_70 = MF;
  local_6c = MAT;
  _Var1 = std::
          visit<njoy::ENDFtk::section::Type<2,151>::ResonanceRange::LRU()const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::Type<2,151>::SpecialCase,njoy::ENDFtk::section::Type<2,151>::SingleLevelBreitWigner,njoy::ENDFtk::section::Type<2,151>::MultiLevelBreitWigner,njoy::ENDFtk::section::Type<2,151>::ReichMoore,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited,njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyIndependent,njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependentFissionWidths,njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependent>const&>
                    ((anon_class_1_0_00000001 *)local_58,
                     (variant<njoy::ENDFtk::section::Type<2,_151>::SpecialCase,_njoy::ENDFtk::section::Type<2,_151>::SingleLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::MultiLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::ReichMoore,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyIndependent,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependentFissionWidths,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependent>
                      *)__variants);
  _Var2 = std::
          visit<njoy::ENDFtk::section::Type<2,151>::ResonanceRange::LRF()const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::Type<2,151>::SpecialCase,njoy::ENDFtk::section::Type<2,151>::SingleLevelBreitWigner,njoy::ENDFtk::section::Type<2,151>::MultiLevelBreitWigner,njoy::ENDFtk::section::Type<2,151>::ReichMoore,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited,njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyIndependent,njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependentFissionWidths,njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependent>const&>
                    ((anon_class_1_0_00000001 *)local_58,
                     (variant<njoy::ENDFtk::section::Type<2,_151>::SpecialCase,_njoy::ENDFtk::section::Type<2,_151>::SingleLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::MultiLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::ReichMoore,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyIndependent,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependentFissionWidths,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependent>
                      *)__variants);
  local_58._16_8_ = SEXT48(_Var2);
  local_58._8_8_ = ZEXT18((byte)this[0x118]);
  local_58._0_8_ = SEXT48(*(int *)(this + 0x10));
  local_58._40_4_ = (int)local_68;
  local_58._32_8_ = uStack_60;
  local_58._44_4_ = (int)((ulong)local_68 >> 0x20);
  local_58._24_8_ = (long)_Var1;
  ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ControlRecord *)local_58,it,local_6c,local_70,local_74);
  if (this[0x118] == (ResonanceRange)0x1) {
    TabulationRecord::print<std::back_insert_iterator<std::__cxx11::string>>
              ((TabulationRecord *)(this + 0x88),it,local_6c,local_70,local_74);
  }
  local_58._8_8_ = &local_6c;
  local_58._16_8_ = &local_70;
  local_58._24_8_ = &local_74;
  local_58._0_8_ = it;
  std::
  visit<njoy::ENDFtk::section::Type<2,151>::ResonanceRange::print<std::back_insert_iterator<std::__cxx11::string>>(std::back_insert_iterator<std::__cxx11::string>&,int,int,int)const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::Type<2,151>::SpecialCase,njoy::ENDFtk::section::Type<2,151>::SingleLevelBreitWigner,njoy::ENDFtk::section::Type<2,151>::MultiLevelBreitWigner,njoy::ENDFtk::section::Type<2,151>::ReichMoore,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited,njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyIndependent,njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependentFissionWidths,njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependent>const&>
            ((anon_class_32_4_f17ee1e6 *)local_58,
             (variant<njoy::ENDFtk::section::Type<2,_151>::SpecialCase,_njoy::ENDFtk::section::Type<2,_151>::SingleLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::MultiLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::ReichMoore,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyIndependent,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependentFissionWidths,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependent>
              *)__variants);
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

  ControlRecord( this->EL(), this->EH(),
                 this->LRU(), this->LRF(),
                 this->NRO(), this->NAPS() ).print( it, MAT, MF, MT );
  if ( this->NRO() ) { this->scattering_radius_->print( it, MAT, MF, MT ); }
  std::visit( [&] ( const auto& v ) -> void
                  { return v.print( it, MAT, MF, MT ); },
              this->parameters_ );
}